

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_arena.h
# Opt level: O2

void * __thiscall
google::protobuf::internal::SerialArena::
AllocateAligned<(google::protobuf::internal::AllocationClient)0>(SerialArena *this,size_t n)

{
  bool bVar1;
  string *psVar2;
  size_type sVar3;
  char *pcVar4;
  undefined8 uStack_30;
  void *ptr;
  
  if ((n & 7) == 0) {
    ptr = (this->ptr_)._M_b._M_p;
    psVar2 = absl::lts_20240722::log_internal::Check_GEImpl<char*,char*>
                       (&this->limit_,(char **)&ptr,"limit_ >= ptr()");
    if (psVar2 == (string *)0x0) {
      bVar1 = MaybeAllocateAligned(this,n,&ptr);
      if (!bVar1) {
        ptr = AllocateAlignedFallback(this,n);
      }
      return ptr;
    }
    pcVar4 = (psVar2->_M_dataplus)._M_p;
    sVar3 = psVar2->_M_string_length;
    uStack_30 = 0x76;
  }
  else {
    pcVar4 = "internal::ArenaAlignDefault::IsAligned(n)";
    uStack_30 = 0x75;
    sVar3 = 0x29;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&ptr,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/serial_arena.h"
             ,uStack_30,sVar3,pcVar4);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&ptr);
}

Assistant:

void* AllocateAligned(size_t n) {
    ABSL_DCHECK(internal::ArenaAlignDefault::IsAligned(n));
    ABSL_DCHECK_GE(limit_, ptr());

    if (alloc_client == AllocationClient::kArray) {
      if (void* res = TryAllocateFromCachedBlock(n)) {
        return res;
      }
    }

    void* ptr;
    if (PROTOBUF_PREDICT_TRUE(MaybeAllocateAligned(n, &ptr))) {
      return ptr;
    }
    return AllocateAlignedFallback(n);
  }